

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O0

void mf_repdata_allocbuf(MF_REPLACEMENT_DATA_t *rd)

{
  uint uVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  
  uVar1 = mf_repdata_bookreplacements((ACT_NODE_t *)rd);
  *(uint *)(in_RDI + 4) = uVar1;
  if (*(int *)(in_RDI + 4) != 0) {
    pvVar2 = malloc(0x800);
    *in_RDI = pvVar2;
    pvVar2 = malloc(0x400);
    in_RDI[2] = pvVar2;
  }
  return;
}

Assistant:

void mf_repdata_allocbuf (MF_REPLACEMENT_DATA_t *rd)
{    
    /* Bookmark replacement pattern for faster retrieval */
    rd->has_replacement = mf_repdata_bookreplacements (rd->trie->root);
    
    if (rd->has_replacement)
    {
        rd->buffer.astring = (AC_ALPHABET_t *) 
                malloc (MF_REPLACEMENT_BUFFER_SIZE * sizeof(AC_ALPHABET_t));
        
        rd->backlog.astring = (AC_ALPHABET_t *) 
                malloc (AC_PATTRN_MAX_LENGTH * sizeof(AC_ALPHABET_t));
        
        /* Backlog length is not bigger than the max pattern length */
    }
}